

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainWindow.cpp
# Opt level: O3

void __thiscall
MainWindow::configureActions(MainWindow *this,QWidget *widget,ShortcutTable *shortcuts)

{
  QKeySequence *pQVar1;
  char cVar2;
  bool bVar3;
  iterator iVar4;
  iterator iVar5;
  QWidget *widget_00;
  QMetaType QVar6;
  PrivateShared *pPVar7;
  QVariant _data;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined8 in_stack_ffffffffffffff90;
  byte local_58;
  undefined7 uStack_57;
  QKeySequence local_50 [8];
  QList<QAction_*> local_48;
  
  QWidget::actions();
  iVar4 = QList<QAction_*>::begin(&local_48);
  iVar5 = QList<QAction_*>::end(&local_48);
  for (; iVar4.i != iVar5.i; iVar4.i = iVar4.i + 1) {
    pPVar7 = (PrivateShared *)&stack0xffffffffffffff90;
    pQVar1 = (QKeySequence *)*iVar4.i;
    cVar2 = QAction::isSeparator();
    if (cVar2 == '\0') {
      QAction::menuObject();
      widget_00 = (QWidget *)QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
      if (widget_00 == (QWidget *)0x0) {
        QAction::data();
        cVar2 = QMetaType::canConvert
                          ((QMetaTypeInterface *)(CONCAT71(uStack_57,local_58) & 0xfffffffffffffffc)
                           ,(QMetaType)0x205248);
        if (cVar2 != '\0') {
          QVar6.d_ptr._4_4_ = in_stack_ffffffffffffff8c;
          QVar6.d_ptr._0_4_ = in_stack_ffffffffffffff88;
          bVar3 = operator==((QMetaType)in_stack_ffffffffffffff90,QVar6);
          if (!bVar3) {
            in_stack_ffffffffffffff8c = 0;
            QVar6.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
            if ((local_58 & 1) != 0) {
              pPVar7 = (PrivateShared *)
                       (in_stack_ffffffffffffff90 +
                       (long)(int)*(uint *)(in_stack_ffffffffffffff90 + 4));
            }
            QMetaType::convert(QVar6,pPVar7,(QMetaType)0x205248,&stack0xffffffffffffff8c);
          }
          ShortcutTable::get((ShortcutTable *)local_50,(Shortcut)shortcuts);
          QAction::setShortcut(pQVar1);
          QKeySequence::~QKeySequence(local_50);
        }
        QVariant::~QVariant((QVariant *)&stack0xffffffffffffff90);
      }
      else {
        configureActions(this,widget_00,shortcuts);
      }
    }
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,8,8);
    }
  }
  return;
}

Assistant:

void MainWindow::configureActions(QWidget &widget, ShortcutTable const& shortcuts) {
    for (auto act : widget.actions()) {
        if (act->isSeparator()) {
            continue;
        } else if (auto menu = act->menu(); menu) {
            // recurse into this menu
            configureActions(*menu, shortcuts);
        } else {
            // check if this action has a shortcut
            auto const _data = act->data();
            if (_data.canConvert<ShortcutTable::Shortcut>()) {
                // yes, set the action's shortcut from the configuration
                act->setShortcut(shortcuts.get(_data.value<ShortcutTable::Shortcut>()));
            }
        }
    }
}